

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

SAT * CompoundFile::loadSSAT(SAT *__return_storage_ptr__,Header *header,istream *stream,SAT *sat)

{
  int iVar1;
  pointer pSVar2;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> ssat;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> chain;
  _Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  SecID local_4c;
  _Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (header->m_ssatFirstSecID).m_id;
  if (iVar1 != -2) {
    local_4c.m_id = iVar1;
    SAT::sectors((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&local_48,sat,
                 &local_4c);
    for (pSVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
        pSVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      std::istream::seekg(stream,(long)pSVar2->m_id * (long)header->m_sectorSize + 0x200,0);
      loadSATSector(stream,(vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                           &local_68,header->m_sectorSize);
    }
    std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
              (&local_48);
  }
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            (&__return_storage_ptr__->m_sat,
             (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&local_68);
  std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
            (&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline SAT
loadSSAT( const Header & header, std::istream & stream,
	const SAT & sat )
{
	std::vector< SecID > ssat;

	if( header.ssatFirstSecID() != SecID::EndOfChain )
	{
		std::vector< SecID > chain = sat.sectors( header.ssatFirstSecID() );

		for( std::vector< SecID >::const_iterator it = chain.begin(),
			last = chain.end(); it != last; ++it )
		{
			stream.seekg( calcFileOffset( *it, header.sectorSize() ) );

			loadSATSector( stream, ssat, header.sectorSize() );
		}
	}

	return SAT( ssat );
}